

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.cpp
# Opt level: O3

maybe<unsigned_long,_void> *
anon_unknown.dwarf_3d003b::get64
          (maybe<unsigned_long,_void> *__return_storage_ptr__,string *str,uint index)

{
  char cVar1;
  uint uVar2;
  type tVar3;
  maybe<unsigned_int,_void> in_RAX;
  uint *puVar4;
  maybe<unsigned_long,_void> *pmVar5;
  type tVar6;
  long lVar7;
  maybe<unsigned_int,_void> local_38;
  
  if (str->_M_string_length <= (ulong)index) {
    pstore::assert_failed
              ("index < str.length ()",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/support/uint128.cpp"
               ,0x26);
  }
  lVar7 = 0x3c;
  tVar6 = (type)0x0;
  local_38 = in_RAX;
  do {
    cVar1 = (str->_M_dataplus)._M_p[index];
    uVar2 = (uint)cVar1;
    if ((byte)(cVar1 + 0x9fU) < 6) {
      tVar3 = (type)(uVar2 - 0x57);
    }
    else if ((byte)(cVar1 + 0xbfU) < 6) {
      tVar3 = (type)(uVar2 - 0x37);
    }
    else {
      if (9 < (byte)(cVar1 - 0x30U)) {
        *(undefined8 *)__return_storage_ptr__ = 0;
        __return_storage_ptr__->storage_ = (type)0x0;
        return (maybe<unsigned_long,_void> *)(ulong)uVar2;
      }
      tVar3 = (type)(uVar2 - 0x30);
    }
    local_38.valid_ = true;
    local_38.storage_ = tVar3;
    puVar4 = pstore::maybe<unsigned_int,void>::
             value_impl<pstore::maybe<unsigned_int,void>const&,unsigned_int_const>(&local_38);
    pmVar5 = (maybe<unsigned_long,_void> *)((ulong)*puVar4 << ((byte)lVar7 & 0x3f));
    tVar6.__data = tVar6.__data | (ulong)pmVar5;
    lVar7 = lVar7 + -4;
    index = index + 1;
  } while (lVar7 != -4);
  __return_storage_ptr__->valid_ = true;
  __return_storage_ptr__->storage_ = tVar6;
  return pmVar5;
}

Assistant:

maybe<std::uint64_t> get64 (std::string const & str, unsigned index) {
        PSTORE_ASSERT (index < str.length ());
        auto result = std::uint64_t{0};
        for (auto shift = 60; shift >= 0; shift -= 4, ++index) {
            auto const digit = hex_to_digit (str[index]);
            if (!digit) {
                return nothing<std::uint64_t> ();
            }
            result |=
                (static_cast<std::uint64_t> (digit.value ()) << static_cast<unsigned> (shift));
        }
        return just (result);
    }